

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_stdout_and_stderr_to_file_swap(void)

{
  int iVar1;
  int iVar2;
  uv_loop_t *puVar3;
  uv_buf_t uVar4;
  char *local_228;
  char *local_220;
  undefined1 local_218 [8];
  uv_buf_t buf;
  uv_stdio_container_t stdio [3];
  undefined1 local_1d0 [8];
  uv_fs_t fs_req;
  uv_file stderr_file;
  uv_file stdout_file;
  int r;
  
  unlink("stdout_file");
  unlink("stderr_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar1 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_1d0,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  if (iVar1 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x200,"r != -1");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1d0);
  iVar1 = dup2(iVar1,1);
  if (iVar1 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x203,"stdout_file != -1");
    abort();
  }
  iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_1d0,"stderr_file",0x42,0x180,(uv_fs_cb)0x0);
  if (iVar2 == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x208,"r != -1");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1d0);
  fs_req.bufsml[3].len._4_4_ = dup2(iVar2,2);
  if (fs_req.bufsml[3].len._4_4_ == -1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x20b,"stderr_file != -1");
    abort();
  }
  options.stdio = (uv_stdio_container_t *)&buf.len;
  buf.len._0_4_ = 0;
  options.stdio_count = 3;
  puVar3 = uv_default_loop();
  iVar2 = uv_spawn(puVar3,&process,&options);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x218,"r == 0");
    abort();
  }
  puVar3 = uv_default_loop();
  iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
  if (iVar2 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x21b,"r == 0");
    abort();
  }
  if (exit_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x21d,"exit_cb_called == 1");
    abort();
  }
  if (close_cb_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x21e,"close_cb_called == 1");
    abort();
  }
  uVar4 = uv_buf_init(output,0x400);
  local_228 = uVar4.base;
  local_218 = (undefined1  [8])local_228;
  local_220 = (char *)uVar4.len;
  buf.base = local_220;
  iVar2 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)local_1d0,iVar1,(uv_buf_t *)local_218,1,0,
                     (uv_fs_cb)0x0);
  if (iVar2 < 0xf) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x224,"r >= 15");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1d0);
  iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)local_1d0,iVar1,(uv_fs_cb)0x0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x228,"r == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1d0);
  printf("output is: %s",output);
  iVar1 = strncmp("hello errworld\n",output,0xf);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x22c,"strncmp(\"hello errworld\\n\", output, 15) == 0");
    abort();
  }
  iVar1 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)local_1d0,fs_req.bufsml[3].len._4_4_,
                     (uv_buf_t *)local_218,1,0,(uv_fs_cb)0x0);
  if (iVar1 < 0xc) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x230,"r >= 12");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1d0);
  iVar1 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)local_1d0,fs_req.bufsml[3].len._4_4_,(uv_fs_cb)0x0
                     );
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x234,"r == 0");
    abort();
  }
  uv_fs_req_cleanup((uv_fs_t *)local_1d0);
  printf("output is: %s",output);
  iVar1 = strncmp("hello world\n",output,0xc);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x238,"strncmp(\"hello world\\n\", output, 12) == 0");
    abort();
  }
  unlink("stdout_file");
  unlink("stderr_file");
  puVar3 = uv_default_loop();
  close_loop(puVar3);
  puVar3 = uv_default_loop();
  iVar1 = uv_loop_close(puVar3);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-spawn.c"
            ,0x23e,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(spawn_stdout_and_stderr_to_file_swap) {
#ifndef _WIN32
  int r;
  uv_file stdout_file;
  uv_file stderr_file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[3];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");
  unlink("stderr_file");

  init_process_options("spawn_helper6", exit_cb);

  /* open 'stdout_file' and replace STDOUT_FILENO with it */
  r = uv_fs_open(NULL,
                 &fs_req,
                 "stdout_file",
                 O_CREAT | O_RDWR,
                 S_IRUSR | S_IWUSR,
                 NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);
  stdout_file = dup2(r, STDOUT_FILENO);
  ASSERT(stdout_file != -1);

  /* open 'stderr_file' and replace STDERR_FILENO with it */
  r = uv_fs_open(NULL, &fs_req, "stderr_file", O_CREAT | O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT(r != -1);
  uv_fs_req_cleanup(&fs_req);
  stderr_file = dup2(r, STDERR_FILENO);
  ASSERT(stderr_file != -1);

  /* now we're going to swap them: the child process' stdout will be our
   * stderr_file and vice versa */
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = stderr_file;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.fd = stdout_file;
  options.stdio_count = 3;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  buf = uv_buf_init(output, sizeof(output));

  /* check the content of stdout_file */
  r = uv_fs_read(NULL, &fs_req, stdout_file, &buf, 1, 0, NULL);
  ASSERT(r >= 15);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stdout_file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strncmp("hello errworld\n", output, 15) == 0);

  /* check the content of stderr_file */
  r = uv_fs_read(NULL, &fs_req, stderr_file, &buf, 1, 0, NULL);
  ASSERT(r >= 12);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, stderr_file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT(strncmp("hello world\n", output, 12) == 0);

  /* Cleanup. */
  unlink("stdout_file");
  unlink("stderr_file");

  MAKE_VALGRIND_HAPPY();
  return 0;
#else
  RETURN_SKIP("Unix only test");
#endif
}